

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialAssetId::ConfidentialAssetId(ConfidentialAssetId *this,string *hex_string)

{
  ByteData *this_00;
  uint8_t uVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  size_t sVar3;
  CfdException *pCVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ByteData local_88;
  undefined1 local_70 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  
  this->_vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
  this_00 = &this->data_;
  ByteData::ByteData(this_00,hex_string);
  this->version_ = '\x01';
  sVar3 = ByteData::GetDataSize(this_00);
  if (sVar3 == 0x20) {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,this_00);
    local_38.current._M_current =
         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            )local_70._0_8_;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,&local_30,&local_38,
               (allocator_type *)&local_88);
    ByteData::ByteData(&local_88,&local_50);
  }
  else {
    if (sVar3 != 0x21) {
      if (sVar3 == 0) {
        local_70._0_8_ = "cfdcore_elements_transaction.cpp";
        local_70._8_4_ = 0x161;
        local_70._16_8_ = "ConfidentialAssetId";
        logger::log<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,
                   "Empty ConfidentialAssetId. hex_string={}.",hex_string);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_70._0_8_ = local_70 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"Empty AssetId is invalid.","");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_70);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_70._0_8_ = "cfdcore_elements_transaction.cpp";
      local_70._8_4_ = 0x17a;
      local_70._16_8_ = "ConfidentialAssetId";
      local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ByteData::GetDataSize(this_00);
      logger::log<unsigned_long&>
                ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"AssetId size Invalid. size={}.",
                 (unsigned_long *)&local_50);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_70._0_8_ = local_70 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"AssetId size Invalid.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_70);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,this_00);
    __last._M_current._4_4_ = local_70._12_4_;
    __last._M_current._0_4_ = local_70._8_4_;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,
               (uchar *)(local_70._0_8_ + 1),__last,(allocator_type *)&local_88);
    uVar1 = *(uint8_t *)local_70._0_8_;
    this->version_ = uVar1;
    if (uVar1 == '\0') {
      ByteData::ByteData(&local_88);
    }
    else {
      ByteData::ByteData(&local_88,&local_50);
    }
  }
  puVar2 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((uint8_t *)local_70._0_8_ != (uint8_t *)0x0) {
    operator_delete((void *)local_70._0_8_);
  }
  CheckVersion('\0');
  return;
}

Assistant:

ConfidentialAssetId::ConfidentialAssetId(const std::string &hex_string)
    : data_(hex_string), version_(kConfidentialVersion_1) {
  switch (data_.GetDataSize()) {
    case 0:
      warn(
          CFD_LOG_SOURCE, "Empty ConfidentialAssetId. hex_string={}.",
          hex_string);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Empty AssetId is invalid.");
      break;
    case kAssetSize: {
      // reverse
      const std::vector<uint8_t> &data = data_.GetBytes();
      std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
      data_ = ByteData(reverse_buffer);
      break;
    }
    case kConfidentialDataSize: {
      const std::vector<uint8_t> &data = data_.GetBytes();
      std::vector<uint8_t> buffer(data.cbegin() + 1, data.cend());
      version_ = data[0];
      if (version_ == 0) {
        data_ = ByteData();
      } else {
        data_ = ByteData(buffer);
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "AssetId size Invalid. size={}.",
          data_.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "AssetId size Invalid.");
  }
  CheckVersion(version_);
}